

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

void Abc_NtkPrint256(void)

{
  FILE *__s;
  uint local_24;
  
  __s = fopen("4varfs.txt","w");
  local_24 = 1;
  do {
    fwrite("read_truth ",0xb,1,__s);
    Extra_PrintBinary((FILE *)__s,&local_24,0x10);
    fwrite("; clp; st; w 1.blif; map; cec 1.blif\n",0x25,1,__s);
    local_24 = local_24 + 1;
  } while (local_24 < 0xffff);
  fclose(__s);
  return;
}

Assistant:

void Abc_NtkPrint256()
{
    FILE * pFile;
    unsigned i;
    pFile = fopen( "4varfs.txt", "w" );
    for ( i = 1; i < (1<<16)-1; i++ )
    {
        fprintf( pFile, "read_truth " );
        Extra_PrintBinary( pFile, &i, 16 );
        fprintf( pFile, "; clp; st; w 1.blif; map; cec 1.blif\n" );
    }
    fclose( pFile );
}